

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::full_path(dynamic_string *path)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  dynamic_string *in_RDI;
  dynamic_string fn;
  dynamic_string pn;
  char *p;
  char buf [4096];
  char *in_stack_ffffffffffffef68;
  dynamic_string *in_stack_ffffffffffffef70;
  char *in_stack_ffffffffffffef78;
  dynamic_string *in_stack_ffffffffffffef80;
  undefined7 in_stack_ffffffffffffef90;
  char *in_stack_ffffffffffffef98;
  undefined6 in_stack_ffffffffffffefa0;
  dynamic_string *in_stack_ffffffffffffefc8;
  dynamic_string *in_stack_ffffffffffffefd0;
  char *in_stack_ffffffffffffefd8;
  char local_1018 [4104];
  dynamic_string *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  dynamic_string::dynamic_string((dynamic_string *)&stack0xffffffffffffefd0);
  dynamic_string::dynamic_string((dynamic_string *)&stack0xffffffffffffefc0);
  dynamic_string::get_ptr(local_10);
  split_path(in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  uVar1 = dynamic_string::operator==(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
  if (((bool)uVar1) ||
     (uVar2 = dynamic_string::operator==(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68),
     (bool)uVar2)) {
    pcVar4 = dynamic_string::get_ptr(local_10);
    pcVar4 = realpath(pcVar4,local_1018);
    if (pcVar4 == (char *)0x0) {
      local_1 = 0;
      goto LAB_00129b31;
    }
    dynamic_string::set(in_stack_ffffffffffffef80,in_stack_ffffffffffffef78,
                        (uint)((ulong)in_stack_ffffffffffffef70 >> 0x20));
  }
  else {
    uVar3 = dynamic_string::is_empty((dynamic_string *)&stack0xffffffffffffefd0);
    if ((bool)uVar3) {
      dynamic_string::operator=(in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
    }
    pcVar4 = dynamic_string::get_ptr((dynamic_string *)&stack0xffffffffffffefd0);
    pcVar4 = realpath(pcVar4,local_1018);
    if (pcVar4 == (char *)0x0) {
      local_1 = 0;
      goto LAB_00129b31;
    }
    dynamic_string::get_ptr((dynamic_string *)&stack0xffffffffffffefc0);
    combine_path((dynamic_string *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffefa0)),
                 in_stack_ffffffffffffef98,(char *)CONCAT17(uVar3,in_stack_ffffffffffffef90));
    in_stack_ffffffffffffef70 = local_10;
  }
  local_1 = 1;
LAB_00129b31:
  dynamic_string::~dynamic_string(in_stack_ffffffffffffef70);
  dynamic_string::~dynamic_string(in_stack_ffffffffffffef70);
  return (bool)(local_1 & 1);
}

Assistant:

bool file_utils::full_path(dynamic_string& path) {
#ifdef WIN32
  char buf[1024];
  char* p = _fullpath(buf, path.get_ptr(), sizeof(buf));
  if (!p)
    return false;
#else
  char buf[PATH_MAX];
  char* p;
  dynamic_string pn, fn;
  split_path(path.get_ptr(), pn, fn);
  if ((fn == ".") || (fn == "..")) {
    p = realpath(path.get_ptr(), buf);
    if (!p)
      return false;
    path.set(buf);
  } else {
    if (pn.is_empty())
      pn = "./";
    p = realpath(pn.get_ptr(), buf);
    if (!p)
      return false;
    combine_path(path, buf, fn.get_ptr());
  }
#endif

  return true;
}